

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O3

RDL_pathIterator * RDL_listPaths(uint r,uint p,char mode,RDL_graph *gra,RDL_sPathInfo *spi)

{
  uint uVar1;
  RDL_pathIterator *it;
  RDL_stack *pRVar2;
  uint *element;
  RDL_pathIterator *pRVar3;
  
  it = (RDL_pathIterator *)malloc(0x30);
  pRVar2 = RDL_stack_new();
  it->stack = pRVar2;
  it->mode = mode;
  uVar1 = RDL_bitset_init(&it->compressed_path,(&gra->V)[mode != 'a']);
  it->compressed_number = uVar1;
  it->spi = spi;
  it->gra = gra;
  it->end = '\0';
  element = (uint *)malloc(0x18);
  *element = r;
  element[1] = p;
  element[2] = 0;
  element[4] = 0;
  element[5] = 0;
  RDL_stack_push(it->stack,element);
  pRVar3 = RDL_pathIteratorNext(it);
  if (pRVar3 != (RDL_pathIterator *)0x0) {
    return it;
  }
  (*RDL_outputFunc)(RDL_ERROR,"Failed iterator initialization!\n");
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RDLhandler.c"
                ,0xec,
                "RDL_pathIterator *RDL_listPaths(unsigned int, unsigned int, char, const RDL_graph *, const RDL_sPathInfo *)"
               );
}

Assistant:

static RDL_pathIterator* RDL_listPaths(unsigned r, unsigned p,
                   char mode, const RDL_graph *gra, const RDL_sPathInfo *spi)
{
  unsigned number;
  RDL_lpStackElement *new_element;

  RDL_pathIterator *it = malloc(sizeof(*it));

  it->stack = RDL_stack_new();
  it->mode = mode;

  if(mode == 'a') {
    number = gra->V;
  }
  else {
    number = gra->E;
  }
  it->compressed_number = RDL_bitset_init(&it->compressed_path, number);

  it->spi = spi;
  it->gra = gra;
  it->end = 0;
  new_element = malloc(sizeof(*new_element));
  new_element->r = r;
  new_element->p = p;
  new_element->ai_index = 0;
  new_element->split_copy = NULL;

  RDL_stack_push(it->stack, new_element);

  if (!RDL_pathIteratorNext(it)) {
    RDL_outputFunc(RDL_ERROR, "Failed iterator initialization!\n");
    /* should never happen */
    assert(0);
    return NULL;
  }

  return it;
}